

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManAnalyzeCoDrivers(Gia_Man_t *p,int *pnDrivers,int *pnInverts)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  uint *puVar4;
  int iVar5;
  int i;
  int iVar6;
  
  p_00 = Vec_IntStart(p->nObjs);
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pObj = Gia_ManCo(p,iVar5);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = *(uint *)pObj;
    iVar2 = Gia_ObjFaninId0p(p,pObj);
    puVar4 = (uint *)Vec_IntEntryP(p_00,iVar2);
    *puVar4 = *puVar4 | ((uVar1 >> 0x1d & 1) != 0) + 1;
  }
  iVar2 = 0;
  iVar5 = p_00->nSize;
  if (p_00->nSize < 1) {
    iVar5 = 0;
  }
  iVar6 = 0;
  for (i = 0; iVar5 != i; i = i + 1) {
    iVar3 = Vec_IntEntry(p_00,i);
    iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
    iVar6 = iVar6 + (uint)(iVar3 == 3);
  }
  Vec_IntFree(p_00);
  *pnDrivers = iVar2;
  *pnInverts = iVar6;
  return;
}

Assistant:

void Lf_ManAnalyzeCoDrivers( Gia_Man_t * p, int * pnDrivers, int * pnInverts )
{
    Gia_Obj_t * pObj;
    int i, Entry, nDrivers, nInverts;
    Vec_Int_t * vMarks = Vec_IntStart( Gia_ManObjNum(p) );
    nDrivers = nInverts = 0;
    Gia_ManForEachCo( p, pObj, i )
        *Vec_IntEntryP( vMarks, Gia_ObjFaninId0p(p, pObj) ) |= Gia_ObjFaninC0(pObj) ? 2 : 1;
    Vec_IntForEachEntry( vMarks, Entry, i )
        nDrivers += (int)(Entry != 0), nInverts += (int)(Entry == 3);
    Vec_IntFree( vMarks );
    *pnDrivers = nDrivers;
    *pnInverts = nInverts;
}